

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

void adios2::utils::print_slice_info
               (VariableBase *variable,bool timed,uint64_t *s,uint64_t *c,Dims *count)

{
  ulong uVar1;
  uint uVar2;
  size_type sVar3;
  reference pvVar4;
  ulong *in_RCX;
  long *in_RDX;
  byte in_SIL;
  long in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R8;
  size_t i_1;
  size_t i;
  size_t tdim;
  int tidx;
  bool isaslice;
  size_t nsteps;
  size_t ndim;
  ulong local_58;
  ulong local_50;
  bool local_39;
  
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x58));
  local_39 = false;
  uVar2 = (uint)((in_SIL & 1) != 0);
  if ((in_SIL & 1) != 0) {
    local_39 = *in_RCX < *(ulong *)(in_RDI + 0xf8);
  }
  for (local_50 = 0; local_50 < sVar3; local_50 = local_50 + 1) {
    uVar1 = in_RCX[local_50 + (long)(int)uVar2];
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_R8,local_50);
    if (uVar1 < *pvVar4) {
      local_39 = true;
    }
  }
  if (local_39) {
    fprintf(outf,"%c   slice (%lu:%lu",(ulong)(uint)(int)commentchar,*in_RDX,*in_RDX + *in_RCX + -1)
    ;
    for (local_58 = 1; local_58 < sVar3 + (long)(int)uVar2; local_58 = local_58 + 1) {
      fprintf(outf,", %lu:%lu",in_RDX[local_58],in_RDX[local_58] + in_RCX[local_58] + -1);
    }
    fprintf(outf,")\n");
  }
  return;
}

Assistant:

void print_slice_info(core::VariableBase *variable, bool timed, uint64_t *s, uint64_t *c,
                      Dims count)
{
    // print the slice info in indexing is on and
    // not the complete variable is read
    size_t ndim = variable->m_Shape.size();
    size_t nsteps = variable->m_AvailableStepsCount;
    bool isaslice = false;
    int tidx = (timed ? 1 : 0);
    size_t tdim = ndim + tidx;
    if (timed)
    {
        if (c[0] < nsteps)
            isaslice = true;
    }
    for (size_t i = 0; i < ndim; i++)
    {
        if (c[i + tidx] < count[i])
            isaslice = true;
    }
    if (isaslice)
    {
        fprintf(outf, "%c   slice (%" PRIu64 ":%" PRIu64, commentchar, s[0], s[0] + c[0] - 1);
        for (size_t i = 1; i < tdim; i++)
        {
            fprintf(outf, ", %" PRIu64 ":%" PRIu64, s[i], s[i] + c[i] - 1);
        }
        fprintf(outf, ")\n");
    }
}